

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

void __thiscall
spvtools::EnumSet<spv::Capability>::InsertBucketFor
          (EnumSet<spv::Capability> *this,size_t index,Capability value)

{
  bool bVar1;
  Capability CVar2;
  ElementType EVar3;
  pointer pBVar4;
  bool bVar5;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_88;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_80;
  Bucket *local_78;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_70;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_68;
  Bucket *local_60;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_58;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_50;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
  local_38;
  iterator it;
  Bucket bucket;
  Capability bucket_start;
  Capability value_local;
  size_t index_local;
  EnumSet<spv::Capability> *this_local;
  
  CVar2 = ComputeBucketStart(value);
  EVar3 = ComputeBucketOffset(value);
  it._M_current = (Bucket *)(1L << ((byte)EVar3 & 0x3f));
  local_50._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ::begin(&this->buckets_);
  local_48 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
             ::operator+(&local_50,index);
  __gnu_cxx::
  __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_const*,std::vector<spvtools::EnumSet<spv::Capability>::Bucket,std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>>>
  ::__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket*>
            ((__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_const*,std::vector<spvtools::EnumSet<spv::Capability>::Bucket,std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>>>
              *)&local_40,&local_48);
  local_60 = (Bucket *)
             std::
             vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
             ::emplace<spvtools::EnumSet<spv::Capability>::Bucket>
                       (&this->buckets_,local_40,(Bucket *)&it);
  local_38._M_current = local_60;
  local_58 = std::
             next<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket*,std::vector<spvtools::EnumSet<spv::Capability>::Bucket,std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>>>>
                       ((__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
                         )local_60,1);
  local_68._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ::end(&this->buckets_);
  bVar1 = __gnu_cxx::operator==(&local_58,&local_68);
  bVar5 = true;
  if (!bVar1) {
    local_78 = local_38._M_current;
    local_70 = std::
               next<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket*,std::vector<spvtools::EnumSet<spv::Capability>::Bucket,std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>>>>
                         (local_38,1);
    pBVar4 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
             ::operator->(&local_70);
    bVar5 = CVar2 < pBVar4->start;
  }
  if (!bVar5) {
    __assert_fail("std::next(it) == buckets_.end() || std::next(it)->start > bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x1af,
                  "void spvtools::EnumSet<spv::Capability>::InsertBucketFor(size_t, T) [T = spv::Capability]"
                 );
  }
  local_80._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
       ::begin(&this->buckets_);
  bVar1 = __gnu_cxx::operator==(&local_38,&local_80);
  bVar5 = true;
  if (!bVar1) {
    local_88 = std::
               prev<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket*,std::vector<spvtools::EnumSet<spv::Capability>::Bucket,std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>>>>
                         (local_38,1);
    pBVar4 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spv::Capability>::Bucket_*,_std::vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>_>
             ::operator->(&local_88);
    bVar5 = pBVar4->start < CVar2;
  }
  if (!bVar5) {
    __assert_fail("it == buckets_.begin() || std::prev(it)->start < bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x1b0,
                  "void spvtools::EnumSet<spv::Capability>::InsertBucketFor(size_t, T) [T = spv::Capability]"
                 );
  }
  return;
}

Assistant:

void InsertBucketFor(size_t index, T value) {
    const T bucket_start = ComputeBucketStart(value);
    Bucket bucket = {1ULL << ComputeBucketOffset(value), bucket_start};
    auto it = buckets_.emplace(buckets_.begin() + index, std::move(bucket));
#if defined(NDEBUG)
    (void)it;  // Silencing unused variable warning.
#else
    assert(std::next(it) == buckets_.end() ||
           std::next(it)->start > bucket_start);
    assert(it == buckets_.begin() || std::prev(it)->start < bucket_start);
#endif
  }